

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_string.hpp
# Opt level: O2

void jsoncons::utility::heap_string_factory<unsigned_char,_unsigned_long,_std::allocator<char>_>::
     destroy(pointer ptr)

{
  if (ptr != (pointer)0x0) {
    operator_delete((void *)((long)ptr - (ulong)ptr->offset_),
                    (ulong)ptr->align_pad_ + (ulong)ptr->offset_ + ptr->length_ + 0x30);
    return;
  }
  return;
}

Assistant:

static void destroy(pointer ptr)
        {
            if (ptr != nullptr)
            {
                heap_string_type* rawp = ext_traits::to_plain_pointer(ptr);

                char* q = launder_cast<char*>(rawp);

                char* p = q - ptr->offset_;

                std::size_t mem_size = ptr->align_pad_ + aligned_size(ptr->length_*sizeof(char_type));
                byte_allocator_type byte_alloc(ptr->get_allocator());
                byte_alloc.deallocate(p,mem_size + ptr->offset_);
            }
        }